

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

natwm_error
get_size_hints(xcb_connection_t *connection,xcb_window_t window,xcb_size_hints_t **result)

{
  char cVar1;
  undefined4 uVar2;
  xcb_size_hints_t *pxVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar4;
  uint8_t reply;
  xcb_get_property_cookie_t cookie;
  xcb_size_hints_t *hints;
  xcb_size_hints_t **result_local;
  xcb_window_t window_local;
  xcb_connection_t *connection_local;
  
  uVar4 = 0x1066c8;
  pxVar3 = (xcb_size_hints_t *)malloc(0x48);
  if (pxVar3 == (xcb_size_hints_t *)0x0) {
    connection_local._4_4_ = MEMORY_ALLOCATION_ERROR;
  }
  else {
    uVar2 = xcb_icccm_get_wm_normal_hints_unchecked(connection,window);
    cVar1 = xcb_icccm_get_wm_normal_hints_reply(connection,uVar2,pxVar3,0,in_R8,in_R9,uVar4);
    if (cVar1 == '\x01') {
      *result = pxVar3;
      connection_local._4_4_ = NO_ERROR;
    }
    else {
      connection_local._4_4_ = RESOLUTION_FAILURE;
    }
  }
  return connection_local._4_4_;
}

Assistant:

static enum natwm_error get_size_hints(xcb_connection_t *connection, xcb_window_t window,
                                       xcb_size_hints_t **result)
{
        xcb_size_hints_t *hints = malloc(sizeof(xcb_size_hints_t));

        if (hints == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        xcb_get_property_cookie_t cookie
                = xcb_icccm_get_wm_normal_hints_unchecked(connection, window);
        uint8_t reply = xcb_icccm_get_wm_normal_hints_reply(connection, cookie, hints, NULL);

        if (reply != 1) {
                return RESOLUTION_FAILURE;
        }

        *result = hints;

        return NO_ERROR;
}